

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void learn(lda *l,single_learner *param_2,example *ec)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  features_value_index_iterator *this;
  feature_value *pfVar4;
  uint64_t *puVar5;
  int *piVar6;
  int __c;
  undefined8 in_RDX;
  features_value_iterator *rhs;
  long in_RDI;
  index_feature temp;
  iterator *f;
  iterator __end2;
  iterator __begin2;
  features *__range2;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  uint32_t num_ex;
  lda *in_stack_00000140;
  example **in_stack_ffffffffffffff48;
  feature *this_00;
  undefined4 in_stack_ffffffffffffff50;
  feature_value _x;
  undefined4 in_stack_ffffffffffffff54;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff5c;
  vector<index_feature,_std::allocator<index_feature>_> *in_stack_ffffffffffffff60;
  features *in_stack_ffffffffffffff68;
  features_value_iterator local_88 [2];
  features_value_index_iterator local_78;
  features *local_68;
  features *local_60;
  iterator local_58;
  iterator local_48;
  undefined8 local_38;
  undefined4 local_2c;
  undefined8 local_28;
  uint local_1c;
  undefined8 local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar3 = v_array<example_*>::size((v_array<example_*> *)(in_RDI + 0x88));
  local_1c = (uint)sVar3;
  local_28 = local_18;
  v_array<example_*>::push_back
            ((v_array<example_*> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48);
  local_2c = 0;
  v_array<int>::push_back
            ((v_array<int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (int *)in_stack_ffffffffffffff48);
  local_38 = local_18;
  local_48 = example_predict::begin
                       ((example_predict *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_58 = example_predict::end
                       ((example_predict *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  while( true ) {
    bVar1 = example_predict::iterator::operator!=(&local_48,&local_58);
    if (!bVar1) break;
    local_68 = example_predict::iterator::operator*(&local_48);
    local_60 = local_68;
    features::begin(in_stack_ffffffffffffff68);
    features::end(in_stack_ffffffffffffff68);
    while( true ) {
      rhs = local_88;
      bVar1 = features_value_iterator::operator!=(&local_78.super_features_value_iterator,rhs);
      if (!bVar1) break;
      this = features_value_index_iterator::operator*(&local_78);
      this_00 = (feature *)&stack0xffffffffffffff60;
      uVar7 = local_1c;
      pfVar4 = features_value_iterator::value(&this->super_features_value_iterator);
      _x = *pfVar4;
      puVar5 = (uint64_t *)features_value_index_iterator::index(this,(char *)rhs,__c);
      feature::feature(this_00,_x,*puVar5);
      std::vector<index_feature,_std::allocator<index_feature>_>::push_back
                (in_stack_ffffffffffffff60,(value_type *)CONCAT44(in_stack_ffffffffffffff5c,uVar7));
      pfVar4 = features_value_iterator::value(&this->super_features_value_iterator);
      iVar2 = (int)*pfVar4;
      piVar6 = v_array<int>::operator[]((v_array<int> *)(local_8 + 200),(ulong)local_1c);
      *piVar6 = iVar2 + *piVar6;
      features_value_index_iterator::operator++((features_value_index_iterator *)CONCAT44(iVar2,_x))
      ;
    }
    example_predict::iterator::operator++(&local_48);
  }
  local_1c = local_1c + 1;
  if ((ulong)local_1c == *(ulong *)(local_8 + 0x18)) {
    learn_batch(in_stack_00000140);
  }
  return;
}

Assistant:

void learn(lda &l, LEARNER::single_learner &, example &ec)
{
  uint32_t num_ex = (uint32_t)l.examples.size();
  l.examples.push_back(&ec);
  l.doc_lengths.push_back(0);
  for (features &fs : ec)
  {
    for (features::iterator &f : fs)
    {
      index_feature temp = {num_ex, feature(f.value(), f.index())};
      l.sorted_features.push_back(temp);
      l.doc_lengths[num_ex] += (int)f.value();
    }
  }
  if (++num_ex == l.minibatch)
    learn_batch(l);
}